

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GPUShaderFP64Test5::verifyXFBData
          (GPUShaderFP64Test5 *this,uchar *data_ptr,_test_case *test_case)

{
  _swizzle_type type;
  float fVar1;
  double dVar2;
  int iVar3;
  _variable_type _Var4;
  _variable_type _Var5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  TestError *this_00;
  bool bVar10;
  uint uVar11;
  _variable_type type_00;
  _variable_type type_01;
  _variable_type type_02;
  _variable_type type_03;
  _variable_type type_04;
  _variable_type type_05;
  _variable_type type_06;
  _variable_type type_07;
  char *pcVar12;
  GPUShaderFP64Test5 *pGVar13;
  ulong uVar14;
  long lVar15;
  double *pdVar16;
  ulong uVar17;
  bool bVar18;
  float fVar19;
  double dVar20;
  undefined1 auVar21 [16];
  uint swizzle_order [4];
  string local_258;
  string local_238;
  undefined1 local_218 [16];
  GPUShaderFP64Test5 *local_208;
  ulong local_200;
  long local_1f8;
  double local_1f0;
  double local_1e8;
  undefined8 uStack_1e0;
  ulong local_1d0;
  uint local_1c8 [6];
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  undefined8 auStack_1a0 [13];
  ios_base local_138 [264];
  
  local_208 = this;
  _Var4 = Utils::getBaseVariableType(test_case->dst_type);
  _Var5 = Utils::getBaseVariableType(test_case->src_type);
  uVar6 = Utils::getNumberOfComponentsForVariableType(test_case->dst_type);
  uVar14 = (ulong)uVar6;
  pGVar13 = (GPUShaderFP64Test5 *)(ulong)test_case->src_type;
  uVar7 = Utils::getNumberOfComponentsForVariableType(test_case->src_type);
  local_1c8[0] = 0;
  local_1c8[1] = 0;
  local_1c8[2] = 0;
  local_1c8[3] = 0;
  uVar11 = test_case->src_type - VARIABLE_TYPE_DMAT2;
  if ((0x19 < uVar11) || (bVar18 = true, (0x3fe01ffU >> (uVar11 & 0x1f) & 1) == 0)) {
    type = local_208->m_swizzle_matrix[uVar6 - 1][uVar7 - 1];
    getSwizzleTypeProperties(pGVar13,type,(string *)0x0,(uint *)0x0,local_1c8);
    bVar18 = type == SWIZZLE_TYPE_NONE;
  }
  bVar10 = true;
  lVar15 = 0;
  pGVar13 = local_208;
  local_200 = uVar14;
  local_1d0 = uVar14;
  do {
    uVar17 = 0;
    pdVar16 = (double *)data_ptr;
    local_1f8 = lVar15;
    do {
      uVar6 = (uint)uVar17;
      if (!bVar18) {
        uVar6 = (int)((uVar17 & 0xffffffff) / (local_1d0 & 0xffffffff)) * uVar6 + local_1c8[uVar17];
      }
      iVar3 = (int)(ostringstream *)&local_1a8;
      if ((int)_Var4 < 0x11) {
        if (_Var4 == VARIABLE_TYPE_BOOL) {
LAB_0092acf7:
          local_218._0_4_ = (float)uVar6 + pGVar13->m_base_values[lVar15];
          fVar19 = (float)(int)(float)local_218._0_4_;
          if ((float)local_218._0_4_ != 0.0) {
            fVar19 = 1.4013e-45;
          }
          if (NAN((float)local_218._0_4_)) {
            fVar19 = 1.4013e-45;
          }
          fVar1 = *(float *)pdVar16;
          if (_Var4 != VARIABLE_TYPE_BOOL) {
            fVar19 = (float)(int)(float)local_218._0_4_;
          }
          if (fVar1 != fVar19) {
            local_1b0 = (undefined1  [8])
                        ((pGVar13->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"Invalid boolean/integer value obtained when doing an "
                       ,0x35);
            pcVar12 = "implicit";
            if (test_case->type == TEST_CASE_TYPE_EXPLICIT) {
              pcVar12 = "explicit";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar12,8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8," cast from GLSL type [",0x16);
            Utils::getVariableTypeString_abi_cxx11_
                      (&local_238,(Utils *)(ulong)test_case->src_type,type_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"], component index: [",0x15);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"], value: [",0xb);
            std::ostream::_M_insert<double>((double)(float)local_218._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"] to GLSL type [",0x10);
            Utils::getVariableTypeString_abi_cxx11_
                      (&local_258,(Utils *)(ulong)test_case->dst_type,type_01);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"], retrieved value: [",0x15);
            std::ostream::operator<<((ostringstream *)&local_1a8,(int)fVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"], expected value: [",0x14);
            std::ostream::operator<<((ostringstream *)&local_1a8,(int)fVar19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"], shader used:\n",0x10);
            pcVar12 = (test_case->shader_body)._M_dataplus._M_p;
            if (pcVar12 == (char *)0x0) {
              std::ios::clear(iVar3 + (int)local_1a8[-3]);
            }
            else {
              sVar9 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,pcVar12,sVar9);
            }
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
            bVar10 = false;
            pGVar13 = local_208;
            uVar14 = local_200;
            lVar15 = local_1f8;
          }
          data_ptr = (uchar *)((long)pdVar16 + 4);
        }
        else {
          if (_Var4 != VARIABLE_TYPE_DOUBLE) {
LAB_0092b79c:
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Unrecognized variable type",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                       ,0x2001);
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          local_1e8 = (double)uVar6 + (double)pGVar13->m_base_values[lVar15];
          local_218._8_8_ = 0;
          local_218._0_8_ = local_1e8;
          if (_Var5 == VARIABLE_TYPE_UINT) {
            local_1e8 = (double)((long)(double)(~-(ulong)(local_1e8 < 0.0) & (ulong)local_1e8 |
                                               (ulong)(double)(uVar6 + (int)(long)pGVar13->
                                                  m_base_values[lVar15]) & -(ulong)(local_1e8 < 0.0)
                                               ) & 0xffffffff);
          }
          else if (_Var5 == VARIABLE_TYPE_INT) {
            local_1e8 = (double)(int)local_1e8;
          }
          else if ((_Var5 == VARIABLE_TYPE_BOOL) &&
                  (iVar8 = (int)local_1e8, local_1e8 = 0.0, iVar8 != 0)) {
            local_1e8 = 1.0;
          }
          uStack_1e0 = 0;
          local_1f0 = *pdVar16;
          data_ptr = (uchar *)(pdVar16 + 1);
          dVar2 = local_1f0 - local_1e8;
          dVar20 = -dVar2;
          if (-dVar2 <= dVar2) {
            dVar20 = dVar2;
          }
          if (9.999999747378752e-06 < dVar20) {
            local_1b0 = (undefined1  [8])
                        ((pGVar13->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,
                       "Invalid double-precision floating-point value obtained when doing an ",0x45)
            ;
            pcVar12 = "implicit";
            if (test_case->type == TEST_CASE_TYPE_EXPLICIT) {
              pcVar12 = "explicit";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar12,8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8," cast from GLSL type [",0x16);
            Utils::getVariableTypeString_abi_cxx11_
                      (&local_238,(Utils *)(ulong)test_case->src_type,type_06);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"], component index: [",0x15);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"], value: [",0xb);
            std::ostream::_M_insert<double>((double)local_218._0_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"] to GLSL type [",0x10);
            Utils::getVariableTypeString_abi_cxx11_
                      (&local_258,(Utils *)(ulong)test_case->dst_type,type_07);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"], retrieved value: [",0x15);
            *(undefined8 *)((long)auStack_1a0 + (long)local_1a8[-3]) = 0x10;
            std::ostream::_M_insert<double>(local_1f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"], expected value: [",0x14);
            *(undefined8 *)((long)auStack_1a0 + (long)local_1a8[-3]) = 0x10;
            std::ostream::_M_insert<double>(local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"], shader used:\n",0x10);
            pcVar12 = (test_case->shader_body)._M_dataplus._M_p;
            if (pcVar12 == (char *)0x0) {
              std::ios::clear(iVar3 + (int)local_1a8[-3]);
            }
            else {
              sVar9 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,pcVar12,sVar9);
            }
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_0092b6f6;
          }
        }
      }
      else if (_Var4 == VARIABLE_TYPE_FLOAT) {
        fVar19 = (float)uVar6 + pGVar13->m_base_values[lVar15];
        local_218 = ZEXT416((uint)fVar19);
        if (_Var5 == VARIABLE_TYPE_UINT) {
          fVar19 = (float)((long)fVar19 & 0xffffffff);
        }
        else if (_Var5 == VARIABLE_TYPE_INT) {
          fVar19 = (float)(int)fVar19;
        }
        else if (_Var5 == VARIABLE_TYPE_BOOL) {
          fVar19 = (float)(-(uint)(fVar19 != 0.0) & 0x3f800000);
        }
        data_ptr = (uchar *)((long)pdVar16 + 4);
        local_1f0 = (double)CONCAT44(local_1f0._4_4_,*(float *)pdVar16);
        local_1e8 = (double)(ulong)(uint)fVar19;
        uStack_1e0 = 0;
        fVar19 = *(float *)pdVar16 - fVar19;
        auVar21._0_4_ = -fVar19;
        auVar21._4_4_ = 0x80000000;
        auVar21._8_4_ = 0x80000000;
        auVar21._12_4_ = 0x80000000;
        if (auVar21._0_4_ <= fVar19) {
          auVar21._0_4_ = fVar19;
        }
        if (1e-05 < auVar21._0_4_) {
          local_1b0 = (undefined1  [8])
                      ((pGVar13->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,
                     "Invalid single-precision floating-point value obtained when doing an ",0x45);
          pcVar12 = "implicit";
          if (test_case->type == TEST_CASE_TYPE_EXPLICIT) {
            pcVar12 = "explicit";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar12,8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8," cast from GLSL type [",0x16);
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_238,(Utils *)(ulong)test_case->src_type,type_04);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"], component index: [",0x15);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"], value: [",0xb);
          std::ostream::_M_insert<double>((double)(float)local_218._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"] to GLSL type [",0x10);
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_258,(Utils *)(ulong)test_case->dst_type,type_05);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"], retrieved value: [",0x15);
          *(undefined8 *)((long)auStack_1a0 + (long)local_1a8[-3]) = 0x10;
          std::ostream::_M_insert<double>((double)local_1f0._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"], expected value: [",0x14);
          *(undefined8 *)((long)auStack_1a0 + (long)local_1a8[-3]) = 0x10;
          std::ostream::_M_insert<double>((double)local_1e8._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"], shader used:\n",0x10);
          pcVar12 = (test_case->shader_body)._M_dataplus._M_p;
          if (pcVar12 == (char *)0x0) {
            std::ios::clear(iVar3 + (int)local_1a8[-3]);
          }
          else {
            sVar9 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar12,sVar9);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0092b6f6:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
LAB_0092b74c:
          bVar10 = false;
          pGVar13 = local_208;
          uVar14 = local_200;
          lVar15 = local_1f8;
        }
      }
      else {
        if (_Var4 != VARIABLE_TYPE_UINT) {
          if (_Var4 != VARIABLE_TYPE_INT) goto LAB_0092b79c;
          goto LAB_0092acf7;
        }
        fVar19 = (float)uVar6 + pGVar13->m_base_values[lVar15];
        data_ptr = (uchar *)((long)pdVar16 + 4);
        if ((0.0 <= fVar19) && (local_218._0_4_ = fVar19, *(float *)pdVar16 != (float)(long)fVar19))
        {
          local_1b0 = (undefined1  [8])
                      ((pGVar13->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Invalid unsigned integer value obtained when doing an ",
                     0x36);
          pcVar12 = "implicit";
          if (test_case->type == TEST_CASE_TYPE_EXPLICIT) {
            pcVar12 = "explicit";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar12,8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8," cast from GLSL type [",0x16);
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_238,(Utils *)(ulong)test_case->src_type,type_02);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"], component index: [",0x15);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"], value: [",0xb);
          std::ostream::_M_insert<double>((double)(float)local_218._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"] to GLSL type [",0x10);
          Utils::getVariableTypeString_abi_cxx11_
                    (&local_258,(Utils *)(ulong)test_case->dst_type,type_03);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"], retrieved value: [",0x15);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"], expected value: [",0x14);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"], shader used:\n",0x10);
          pcVar12 = (test_case->shader_body)._M_dataplus._M_p;
          if (pcVar12 == (char *)0x0) {
            std::ios::clear(iVar3 + (int)local_1a8[-3]);
          }
          else {
            sVar9 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar12,sVar9);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          goto LAB_0092b74c;
        }
      }
      uVar17 = uVar17 + 1;
      pdVar16 = (double *)data_ptr;
    } while (uVar14 != uVar17);
    lVar15 = lVar15 + 1;
    if (lVar15 == 5) {
      return bVar10;
    }
  } while( true );
}

Assistant:

bool GPUShaderFP64Test5::verifyXFBData(const unsigned char* data_ptr, const _test_case& test_case)
{
	const Utils::_variable_type base_dst_type		= Utils::getBaseVariableType(test_case.dst_type);
	const Utils::_variable_type base_src_type		= Utils::getBaseVariableType(test_case.src_type);
	const float					epsilon				= 1e-5f;
	const unsigned int			n_base_values		= sizeof(m_base_values) / sizeof(m_base_values[0]);
	const unsigned int			n_result_components = Utils::getNumberOfComponentsForVariableType(test_case.dst_type);
	const unsigned int			n_src_components	= Utils::getNumberOfComponentsForVariableType(test_case.src_type);
	bool						result				= true;
	_swizzle_type				swizzle_operator	= SWIZZLE_TYPE_NONE;
	unsigned int				swizzle_order[4]	= { 0 };
	const unsigned char*		traveller_ptr		= data_ptr;

	if (!Utils::isMatrixVariableType(test_case.src_type))
	{
		DE_ASSERT(n_result_components >= 1 && n_result_components <= 4);
		DE_ASSERT(n_src_components >= 1 && n_src_components <= 4);

		swizzle_operator = m_swizzle_matrix[n_result_components - 1][n_src_components - 1];

		getSwizzleTypeProperties(swizzle_operator, DE_NULL, /* out_swizzle_string */
								 DE_NULL,					/* out_n_components */
								 swizzle_order);
	}

	for (unsigned int n_base_value = 0; n_base_value < n_base_values; ++n_base_value)
	{
		for (unsigned int n_result_component = 0; n_result_component < n_result_components; ++n_result_component)
		{
			unsigned int n_swizzled_component = n_result_component;

			if (swizzle_operator != SWIZZLE_TYPE_NONE)
			{
				n_swizzled_component =
					(n_result_component / n_result_components) * n_result_component + swizzle_order[n_result_component];
			}

			switch (base_dst_type)
			{
			case Utils::VARIABLE_TYPE_BOOL:
			case Utils::VARIABLE_TYPE_INT:
			{
				double ref_expected_value = (m_base_values[n_base_value]) + static_cast<float>(n_swizzled_component);
				double expected_value	 = ref_expected_value;
				int	result_value		  = *((int*)traveller_ptr);

				if (base_dst_type == Utils::VARIABLE_TYPE_BOOL)
				{
					if (expected_value != 0.0)
					{
						expected_value = 1.0;
					}
				}

				if (result_value != (int)expected_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid boolean/integer value obtained when doing an "
									   << ((test_case.type == TEST_CASE_TYPE_EXPLICIT) ? "explicit" : "implicit")
									   << " cast from GLSL type [" << Utils::getVariableTypeString(test_case.src_type)
									   << "]"
										  ", component index: ["
									   << n_swizzled_component << "]"
																  ", value: ["
									   << ref_expected_value << "]"
																" to GLSL type ["
									   << Utils::getVariableTypeString(test_case.dst_type) << "]"
																							  ", retrieved value: ["
									   << result_value << "]"
														  ", expected value: ["
									   << (int)expected_value << "]"
																 ", shader used:\n"
									   << test_case.shader_body.c_str() << tcu::TestLog::EndMessage;

					result = false;
				}

				traveller_ptr += sizeof(int);
				break;
			} /* VARIABLE_TYPE_BOOL or VARIABLE_TYPE_INT cases */

			case Utils::VARIABLE_TYPE_DOUBLE:
			{
				double ref_expected_value = m_base_values[n_base_value] + (double)n_swizzled_component;
				double expected_value	 = ref_expected_value;
				double result_value		  = *((double*)traveller_ptr);

				if (base_src_type == Utils::VARIABLE_TYPE_BOOL)
				{
					expected_value = ((int)expected_value != 0.0) ? 1.0 : 0.0;
				}
				else if (base_src_type == Utils::VARIABLE_TYPE_INT)
				{
					expected_value = (int)expected_value;
				}
				else if (base_src_type == Utils::VARIABLE_TYPE_UINT)
				{
					// Negative values in base values array when converted to unsigned int will be ZERO
					// Addition operations done inside the shader in such cases will operate on ZERO rather
					// than the negative value being passed.
					// Replicate the sequence of conversion and addition operations done on the
					// shader input, to calculate the expected values in XFB data in the
					// problematic cases.
					if (expected_value < 0)
					{
						expected_value = (unsigned int)m_base_values[n_base_value] + n_swizzled_component;
					}
					expected_value = (unsigned int)expected_value;
				}

				traveller_ptr += sizeof(double);
				if (de::abs(result_value - expected_value) > epsilon)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid double-precision floating-point value obtained when doing an "
									   << ((test_case.type == TEST_CASE_TYPE_EXPLICIT) ? "explicit" : "implicit")
									   << " cast from GLSL type [" << Utils::getVariableTypeString(test_case.src_type)
									   << "]"
										  ", component index: ["
									   << n_swizzled_component << "]"
																  ", value: ["
									   << ref_expected_value << "]"
																" to GLSL type ["
									   << Utils::getVariableTypeString(test_case.dst_type) << "]"
																							  ", retrieved value: ["
									   << std::setprecision(16) << result_value << "]"
																				   ", expected value: ["
									   << std::setprecision(16) << expected_value << "]"
																					 ", shader used:\n"
									   << test_case.shader_body.c_str() << tcu::TestLog::EndMessage;

					result = false;
				}

				break;
			} /* VARIABLE_TYPE_DOUBLE case */

			case Utils::VARIABLE_TYPE_FLOAT:
			{
				float ref_expected_value = (float)m_base_values[n_base_value] + (float)n_swizzled_component;
				float expected_value	 = ref_expected_value;
				float result_value		 = *((float*)traveller_ptr);

				if (base_src_type == Utils::VARIABLE_TYPE_BOOL)
				{
					expected_value = (expected_value != 0.0f) ? 1.0f : 0.0f;
				}
				else if (base_src_type == Utils::VARIABLE_TYPE_INT)
				{
					expected_value = (float)((int)expected_value);
				}
				else if (base_src_type == Utils::VARIABLE_TYPE_UINT)
				{
					expected_value = (float)((unsigned int)expected_value);
				}

				traveller_ptr += sizeof(float);
				if (de::abs(result_value - expected_value) > epsilon)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid single-precision floating-point value obtained when doing an "
									   << ((test_case.type == TEST_CASE_TYPE_EXPLICIT) ? "explicit" : "implicit")
									   << " cast from GLSL type [" << Utils::getVariableTypeString(test_case.src_type)
									   << "]"
										  ", component index: ["
									   << n_swizzled_component << "]"
																  ", value: ["
									   << ref_expected_value << "]"
																" to GLSL type ["
									   << Utils::getVariableTypeString(test_case.dst_type) << "]"
																							  ", retrieved value: ["
									   << std::setprecision(16) << result_value << "]"
																				   ", expected value: ["
									   << std::setprecision(16) << expected_value << "]"
																					 ", shader used:\n"
									   << test_case.shader_body.c_str() << tcu::TestLog::EndMessage;

					result = false;
				}

				break;
			} /* VARIABLE_TYPE_FLOAT case */

			case Utils::VARIABLE_TYPE_UINT:
			{
				double ref_expected_value = (m_base_values[n_base_value]) + static_cast<float>(n_swizzled_component);
				double expected_value	 = ref_expected_value;
				unsigned int result_value = *((unsigned int*)traveller_ptr);

				traveller_ptr += sizeof(unsigned int);
				if (result_value != (unsigned int)expected_value)
				{
					if (expected_value < 0.0)
					{
						// It is undefined to convert a negative floating-point value to an uint.
						break;
					}

					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid unsigned integer value obtained when doing an "
									   << ((test_case.type == TEST_CASE_TYPE_EXPLICIT) ? "explicit" : "implicit")
									   << " cast from GLSL type [" << Utils::getVariableTypeString(test_case.src_type)
									   << "]"
										  ", component index: ["
									   << n_swizzled_component << "]"
																  ", value: ["
									   << ref_expected_value << "]"
																" to GLSL type ["
									   << Utils::getVariableTypeString(test_case.dst_type) << "]"
																							  ", retrieved value: ["
									   << result_value << "]"
														  ", expected value: ["
									   << (unsigned int)expected_value << "]"
																		  ", shader used:\n"
									   << test_case.shader_body.c_str() << tcu::TestLog::EndMessage;

					result = false;
				}

				break;
			} /* VARIABLE_TYPE_UINT case */

			default:
			{
				TCU_FAIL("Unrecognized variable type");
			}
			} /* switch (test_case.dst_type) */
		}	 /* for (all result components) */
	}		  /* for (all base values) */

	return result;
}